

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O1

ostream * deqp::gles31::bb::operator<<(ostream *stream,BufferVarLayoutEntry *entry)

{
  ostream *poVar1;
  char *pcVar2;
  size_t sVar3;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,(entry->name)._M_dataplus._M_p,(entry->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," { type = ",10);
  pcVar2 = glu::getDataTypeName(entry->type);
  if (pcVar2 == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)poVar1->_vptr_basic_ostream[-3]);
  }
  else {
    sVar3 = strlen(pcVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar2,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", blockNdx = ",0xd);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,entry->blockNdx);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", offset = ",0xb);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,entry->offset);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", arraySize = ",0xe);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,entry->arraySize);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", arrayStride = ",0x10);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,entry->arrayStride);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", matrixStride = ",0x11);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,entry->matrixStride);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", topLevelArraySize = ",0x16);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,entry->topLevelArraySize);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", topLevelArrayStride = ",0x18);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,entry->topLevelArrayStride);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", isRowMajor = ",0xf);
  pcVar2 = "false";
  if ((ulong)entry->isRowMajor != 0) {
    pcVar2 = "true";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar2,(ulong)entry->isRowMajor ^ 5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," }",2);
  return stream;
}

Assistant:

std::ostream& operator<< (std::ostream& stream, const BufferVarLayoutEntry& entry)
{
	stream << entry.name << " { type = " << glu::getDataTypeName(entry.type)
		   << ", blockNdx = " << entry.blockNdx
		   << ", offset = " << entry.offset
		   << ", arraySize = " << entry.arraySize
		   << ", arrayStride = " << entry.arrayStride
		   << ", matrixStride = " << entry.matrixStride
		   << ", topLevelArraySize = " << entry.topLevelArraySize
		   << ", topLevelArrayStride = " << entry.topLevelArrayStride
		   << ", isRowMajor = " << (entry.isRowMajor ? "true" : "false")
		   << " }";
	return stream;
}